

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorting_network.h
# Opt level: O0

void av1_sort_fi32_16(float *k,int32_t *v)

{
  undefined4 *in_RSI;
  float *in_RDI;
  int mini_64;
  int maxi_64;
  float minf_64;
  float maxf_64;
  int mini_63;
  int maxi_63;
  float minf_63;
  float maxf_63;
  int mini_62;
  int maxi_62;
  float minf_62;
  float maxf_62;
  int mini_61;
  int maxi_61;
  float minf_61;
  float maxf_61;
  int mini_60;
  int maxi_60;
  float minf_60;
  float maxf_60;
  int mini_59;
  int maxi_59;
  float minf_59;
  float maxf_59;
  int mini_58;
  int maxi_58;
  float minf_58;
  float maxf_58;
  int mini_57;
  int maxi_57;
  float minf_57;
  float maxf_57;
  int mini_56;
  int maxi_56;
  float minf_56;
  float maxf_56;
  int mini_55;
  int maxi_55;
  float minf_55;
  float maxf_55;
  int mini_54;
  int maxi_54;
  float minf_54;
  float maxf_54;
  int mini_53;
  int maxi_53;
  float minf_53;
  float maxf_53;
  int mini_52;
  int maxi_52;
  float minf_52;
  float maxf_52;
  int mini_51;
  int maxi_51;
  float minf_51;
  float maxf_51;
  int mini_50;
  int maxi_50;
  float minf_50;
  float maxf_50;
  int mini_49;
  int maxi_49;
  float minf_49;
  float maxf_49;
  int mini_48;
  int maxi_48;
  float minf_48;
  float maxf_48;
  int mini_47;
  int maxi_47;
  float minf_47;
  float maxf_47;
  int mini_46;
  int maxi_46;
  float minf_46;
  float maxf_46;
  int mini_45;
  int maxi_45;
  float minf_45;
  float maxf_45;
  int mini_44;
  int maxi_44;
  float minf_44;
  float maxf_44;
  int mini_43;
  int maxi_43;
  float minf_43;
  float maxf_43;
  int mini_42;
  int maxi_42;
  float minf_42;
  float maxf_42;
  int mini_41;
  int maxi_41;
  float minf_41;
  float maxf_41;
  int mini_40;
  int maxi_40;
  float minf_40;
  float maxf_40;
  int mini_39;
  int maxi_39;
  float minf_39;
  float maxf_39;
  int mini_38;
  int maxi_38;
  float minf_38;
  float maxf_38;
  int mini_37;
  int maxi_37;
  float minf_37;
  float maxf_37;
  int mini_36;
  int maxi_36;
  float minf_36;
  float maxf_36;
  int mini_35;
  int maxi_35;
  float minf_35;
  float maxf_35;
  int mini_34;
  int maxi_34;
  float minf_34;
  float maxf_34;
  int mini_33;
  int maxi_33;
  float minf_33;
  float maxf_33;
  int mini_32;
  int maxi_32;
  float minf_32;
  float maxf_32;
  int mini_31;
  int maxi_31;
  float minf_31;
  float maxf_31;
  int mini_30;
  int maxi_30;
  float minf_30;
  float maxf_30;
  int mini_29;
  int maxi_29;
  float minf_29;
  float maxf_29;
  int mini_28;
  int maxi_28;
  float minf_28;
  float maxf_28;
  int mini_27;
  int maxi_27;
  float minf_27;
  float maxf_27;
  int mini_26;
  int maxi_26;
  float minf_26;
  float maxf_26;
  int mini_25;
  int maxi_25;
  float minf_25;
  float maxf_25;
  int mini_24;
  int maxi_24;
  float minf_24;
  float maxf_24;
  int mini_23;
  int maxi_23;
  float minf_23;
  float maxf_23;
  int mini_22;
  int maxi_22;
  float minf_22;
  float maxf_22;
  int mini_21;
  int maxi_21;
  float minf_21;
  float maxf_21;
  int mini_20;
  int maxi_20;
  float minf_20;
  float maxf_20;
  int mini_19;
  int maxi_19;
  float minf_19;
  float maxf_19;
  int mini_18;
  int maxi_18;
  float minf_18;
  float maxf_18;
  int mini_17;
  int maxi_17;
  float minf_17;
  float maxf_17;
  int mini_16;
  int maxi_16;
  float minf_16;
  float maxf_16;
  int mini_15;
  int maxi_15;
  float minf_15;
  float maxf_15;
  int mini_14;
  int maxi_14;
  float minf_14;
  float maxf_14;
  int mini_13;
  int maxi_13;
  float minf_13;
  float maxf_13;
  int mini_12;
  int maxi_12;
  float minf_12;
  float maxf_12;
  int mini_11;
  int maxi_11;
  float minf_11;
  float maxf_11;
  int mini_10;
  int maxi_10;
  float minf_10;
  float maxf_10;
  int mini_9;
  int maxi_9;
  float minf_9;
  float maxf_9;
  int mini_8;
  int maxi_8;
  float minf_8;
  float maxf_8;
  int mini_7;
  int maxi_7;
  float minf_7;
  float maxf_7;
  int mini_6;
  int maxi_6;
  float minf_6;
  float maxf_6;
  int mini_5;
  int maxi_5;
  float minf_5;
  float maxf_5;
  int mini_4;
  int maxi_4;
  float minf_4;
  float maxf_4;
  int mini_3;
  int maxi_3;
  float minf_3;
  float maxf_3;
  int mini_2;
  int maxi_2;
  float minf_2;
  float maxf_2;
  int mini_1;
  int maxi_1;
  float minf_1;
  float maxf_1;
  int mini;
  int maxi;
  float minf;
  float maxf;
  undefined4 local_830;
  undefined4 local_82c;
  float local_828;
  float local_824;
  undefined4 local_820;
  undefined4 local_81c;
  float local_818;
  float local_814;
  undefined4 local_810;
  undefined4 local_80c;
  float local_808;
  float local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  float local_7f8;
  float local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  float local_7e8;
  float local_7e4;
  undefined4 local_7e0;
  undefined4 local_7dc;
  float local_7d8;
  float local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  float local_7c8;
  float local_7c4;
  undefined4 local_7c0;
  undefined4 local_7bc;
  float local_7b8;
  float local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  float local_7a8;
  float local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  float local_798;
  float local_794;
  undefined4 local_790;
  undefined4 local_78c;
  float local_788;
  float local_784;
  undefined4 local_780;
  undefined4 local_77c;
  float local_778;
  float local_774;
  undefined4 local_770;
  undefined4 local_76c;
  float local_768;
  float local_764;
  undefined4 local_760;
  undefined4 local_75c;
  float local_758;
  float local_754;
  undefined4 local_750;
  undefined4 local_74c;
  float local_748;
  float local_744;
  undefined4 local_740;
  undefined4 local_73c;
  float local_738;
  float local_734;
  undefined4 local_730;
  undefined4 local_72c;
  float local_728;
  float local_724;
  undefined4 local_720;
  undefined4 local_71c;
  float local_718;
  float local_714;
  undefined4 local_710;
  undefined4 local_70c;
  float local_708;
  float local_704;
  undefined4 local_700;
  undefined4 local_6fc;
  float local_6f8;
  float local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  float local_6e8;
  float local_6e4;
  undefined4 local_6e0;
  undefined4 local_6dc;
  float local_6d8;
  float local_6d4;
  undefined4 local_6d0;
  undefined4 local_6cc;
  float local_6c8;
  float local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  float local_6b8;
  float local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  float local_6a8;
  float local_6a4;
  undefined4 local_6a0;
  undefined4 local_69c;
  float local_698;
  float local_694;
  undefined4 local_690;
  undefined4 local_68c;
  float local_688;
  float local_684;
  undefined4 local_680;
  undefined4 local_67c;
  float local_678;
  float local_674;
  undefined4 local_670;
  undefined4 local_66c;
  float local_668;
  float local_664;
  undefined4 local_660;
  undefined4 local_65c;
  float local_658;
  float local_654;
  undefined4 local_650;
  undefined4 local_64c;
  float local_648;
  float local_644;
  undefined4 local_640;
  undefined4 local_63c;
  float local_638;
  float local_634;
  undefined4 local_630;
  undefined4 local_62c;
  float local_628;
  float local_624;
  undefined4 local_620;
  undefined4 local_61c;
  float local_618;
  float local_614;
  undefined4 local_610;
  undefined4 local_60c;
  float local_608;
  float local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  float local_5f8;
  float local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  float local_5e8;
  float local_5e4;
  undefined4 local_5e0;
  undefined4 local_5dc;
  float local_5d8;
  float local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  float local_5c8;
  float local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  float local_5b8;
  float local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  float local_5a8;
  float local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  float local_598;
  float local_594;
  undefined4 local_590;
  undefined4 local_58c;
  float local_588;
  float local_584;
  undefined4 local_580;
  undefined4 local_57c;
  float local_578;
  float local_574;
  undefined4 local_570;
  undefined4 local_56c;
  float local_568;
  float local_564;
  undefined4 local_560;
  undefined4 local_55c;
  float local_558;
  float local_554;
  undefined4 local_550;
  undefined4 local_54c;
  float local_548;
  float local_544;
  undefined4 local_540;
  undefined4 local_53c;
  float local_538;
  float local_534;
  undefined4 local_530;
  undefined4 local_52c;
  float local_528;
  float local_524;
  undefined4 local_520;
  undefined4 local_51c;
  float local_518;
  float local_514;
  undefined4 local_510;
  undefined4 local_50c;
  float local_508;
  float local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  float local_4f8;
  float local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  float local_4e8;
  float local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  float local_4d8;
  float local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  float local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  float local_4b8;
  float local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  float local_4a8;
  float local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  float local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  float local_488;
  float local_484;
  undefined4 local_480;
  undefined4 local_47c;
  float local_478;
  float local_474;
  undefined4 local_470;
  undefined4 local_46c;
  float local_468;
  float local_464;
  undefined4 local_460;
  undefined4 local_45c;
  float local_458;
  float local_454;
  undefined4 local_450;
  undefined4 local_44c;
  float local_448;
  float local_444;
  undefined4 local_440;
  undefined4 local_43c;
  float local_438;
  float local_434;
  undefined4 local_430;
  undefined4 local_42c;
  float local_428;
  float local_424;
  
  if (*in_RDI < in_RDI[1]) {
    local_424 = in_RDI[1];
  }
  else {
    local_424 = *in_RDI;
  }
  if (*in_RDI < in_RDI[1]) {
    local_428 = *in_RDI;
  }
  else {
    local_428 = in_RDI[1];
  }
  if (*in_RDI < in_RDI[1]) {
    local_42c = in_RSI[1];
  }
  else {
    local_42c = *in_RSI;
  }
  if (*in_RDI < in_RDI[1]) {
    local_430 = *in_RSI;
  }
  else {
    local_430 = in_RSI[1];
  }
  *in_RDI = local_424;
  in_RDI[1] = local_428;
  *in_RSI = local_42c;
  in_RSI[1] = local_430;
  if (in_RDI[2] < in_RDI[3]) {
    local_434 = in_RDI[3];
  }
  else {
    local_434 = in_RDI[2];
  }
  if (in_RDI[2] < in_RDI[3]) {
    local_438 = in_RDI[2];
  }
  else {
    local_438 = in_RDI[3];
  }
  if (in_RDI[2] < in_RDI[3]) {
    local_43c = in_RSI[3];
  }
  else {
    local_43c = in_RSI[2];
  }
  if (in_RDI[2] < in_RDI[3]) {
    local_440 = in_RSI[2];
  }
  else {
    local_440 = in_RSI[3];
  }
  in_RDI[2] = local_434;
  in_RDI[3] = local_438;
  in_RSI[2] = local_43c;
  in_RSI[3] = local_440;
  if (in_RDI[4] < in_RDI[5]) {
    local_444 = in_RDI[5];
  }
  else {
    local_444 = in_RDI[4];
  }
  if (in_RDI[4] < in_RDI[5]) {
    local_448 = in_RDI[4];
  }
  else {
    local_448 = in_RDI[5];
  }
  if (in_RDI[4] < in_RDI[5]) {
    local_44c = in_RSI[5];
  }
  else {
    local_44c = in_RSI[4];
  }
  if (in_RDI[4] < in_RDI[5]) {
    local_450 = in_RSI[4];
  }
  else {
    local_450 = in_RSI[5];
  }
  in_RDI[4] = local_444;
  in_RDI[5] = local_448;
  in_RSI[4] = local_44c;
  in_RSI[5] = local_450;
  if (in_RDI[6] < in_RDI[7]) {
    local_454 = in_RDI[7];
  }
  else {
    local_454 = in_RDI[6];
  }
  if (in_RDI[6] < in_RDI[7]) {
    local_458 = in_RDI[6];
  }
  else {
    local_458 = in_RDI[7];
  }
  if (in_RDI[6] < in_RDI[7]) {
    local_45c = in_RSI[7];
  }
  else {
    local_45c = in_RSI[6];
  }
  if (in_RDI[6] < in_RDI[7]) {
    local_460 = in_RSI[6];
  }
  else {
    local_460 = in_RSI[7];
  }
  in_RDI[6] = local_454;
  in_RDI[7] = local_458;
  in_RSI[6] = local_45c;
  in_RSI[7] = local_460;
  if (in_RDI[8] < in_RDI[9]) {
    local_464 = in_RDI[9];
  }
  else {
    local_464 = in_RDI[8];
  }
  if (in_RDI[8] < in_RDI[9]) {
    local_468 = in_RDI[8];
  }
  else {
    local_468 = in_RDI[9];
  }
  if (in_RDI[8] < in_RDI[9]) {
    local_46c = in_RSI[9];
  }
  else {
    local_46c = in_RSI[8];
  }
  if (in_RDI[8] < in_RDI[9]) {
    local_470 = in_RSI[8];
  }
  else {
    local_470 = in_RSI[9];
  }
  in_RDI[8] = local_464;
  in_RDI[9] = local_468;
  in_RSI[8] = local_46c;
  in_RSI[9] = local_470;
  if (in_RDI[10] < in_RDI[0xb]) {
    local_474 = in_RDI[0xb];
  }
  else {
    local_474 = in_RDI[10];
  }
  if (in_RDI[10] < in_RDI[0xb]) {
    local_478 = in_RDI[10];
  }
  else {
    local_478 = in_RDI[0xb];
  }
  if (in_RDI[10] < in_RDI[0xb]) {
    local_47c = in_RSI[0xb];
  }
  else {
    local_47c = in_RSI[10];
  }
  if (in_RDI[10] < in_RDI[0xb]) {
    local_480 = in_RSI[10];
  }
  else {
    local_480 = in_RSI[0xb];
  }
  in_RDI[10] = local_474;
  in_RDI[0xb] = local_478;
  in_RSI[10] = local_47c;
  in_RSI[0xb] = local_480;
  if (in_RDI[0xc] < in_RDI[0xd]) {
    local_484 = in_RDI[0xd];
  }
  else {
    local_484 = in_RDI[0xc];
  }
  if (in_RDI[0xc] < in_RDI[0xd]) {
    local_488 = in_RDI[0xc];
  }
  else {
    local_488 = in_RDI[0xd];
  }
  if (in_RDI[0xc] < in_RDI[0xd]) {
    local_48c = in_RSI[0xd];
  }
  else {
    local_48c = in_RSI[0xc];
  }
  if (in_RDI[0xc] < in_RDI[0xd]) {
    local_490 = in_RSI[0xc];
  }
  else {
    local_490 = in_RSI[0xd];
  }
  in_RDI[0xc] = local_484;
  in_RDI[0xd] = local_488;
  in_RSI[0xc] = local_48c;
  in_RSI[0xd] = local_490;
  if (in_RDI[0xe] < in_RDI[0xf]) {
    local_494 = in_RDI[0xf];
  }
  else {
    local_494 = in_RDI[0xe];
  }
  if (in_RDI[0xe] < in_RDI[0xf]) {
    local_498 = in_RDI[0xe];
  }
  else {
    local_498 = in_RDI[0xf];
  }
  if (in_RDI[0xe] < in_RDI[0xf]) {
    local_49c = in_RSI[0xf];
  }
  else {
    local_49c = in_RSI[0xe];
  }
  if (in_RDI[0xe] < in_RDI[0xf]) {
    local_4a0 = in_RSI[0xe];
  }
  else {
    local_4a0 = in_RSI[0xf];
  }
  in_RDI[0xe] = local_494;
  in_RDI[0xf] = local_498;
  in_RSI[0xe] = local_49c;
  in_RSI[0xf] = local_4a0;
  if (*in_RDI < in_RDI[2]) {
    local_4a4 = in_RDI[2];
  }
  else {
    local_4a4 = *in_RDI;
  }
  if (*in_RDI < in_RDI[2]) {
    local_4a8 = *in_RDI;
  }
  else {
    local_4a8 = in_RDI[2];
  }
  if (*in_RDI < in_RDI[2]) {
    local_4ac = in_RSI[2];
  }
  else {
    local_4ac = *in_RSI;
  }
  if (*in_RDI < in_RDI[2]) {
    local_4b0 = *in_RSI;
  }
  else {
    local_4b0 = in_RSI[2];
  }
  *in_RDI = local_4a4;
  in_RDI[2] = local_4a8;
  *in_RSI = local_4ac;
  in_RSI[2] = local_4b0;
  if (in_RDI[1] < in_RDI[3]) {
    local_4b4 = in_RDI[3];
  }
  else {
    local_4b4 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[3]) {
    local_4b8 = in_RDI[1];
  }
  else {
    local_4b8 = in_RDI[3];
  }
  if (in_RDI[1] < in_RDI[3]) {
    local_4bc = in_RSI[3];
  }
  else {
    local_4bc = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[3]) {
    local_4c0 = in_RSI[1];
  }
  else {
    local_4c0 = in_RSI[3];
  }
  in_RDI[1] = local_4b4;
  in_RDI[3] = local_4b8;
  in_RSI[1] = local_4bc;
  in_RSI[3] = local_4c0;
  if (in_RDI[4] < in_RDI[6]) {
    local_4c4 = in_RDI[6];
  }
  else {
    local_4c4 = in_RDI[4];
  }
  if (in_RDI[4] < in_RDI[6]) {
    local_4c8 = in_RDI[4];
  }
  else {
    local_4c8 = in_RDI[6];
  }
  if (in_RDI[4] < in_RDI[6]) {
    local_4cc = in_RSI[6];
  }
  else {
    local_4cc = in_RSI[4];
  }
  if (in_RDI[4] < in_RDI[6]) {
    local_4d0 = in_RSI[4];
  }
  else {
    local_4d0 = in_RSI[6];
  }
  in_RDI[4] = local_4c4;
  in_RDI[6] = local_4c8;
  in_RSI[4] = local_4cc;
  in_RSI[6] = local_4d0;
  if (in_RDI[5] < in_RDI[7]) {
    local_4d4 = in_RDI[7];
  }
  else {
    local_4d4 = in_RDI[5];
  }
  if (in_RDI[5] < in_RDI[7]) {
    local_4d8 = in_RDI[5];
  }
  else {
    local_4d8 = in_RDI[7];
  }
  if (in_RDI[5] < in_RDI[7]) {
    local_4dc = in_RSI[7];
  }
  else {
    local_4dc = in_RSI[5];
  }
  if (in_RDI[5] < in_RDI[7]) {
    local_4e0 = in_RSI[5];
  }
  else {
    local_4e0 = in_RSI[7];
  }
  in_RDI[5] = local_4d4;
  in_RDI[7] = local_4d8;
  in_RSI[5] = local_4dc;
  in_RSI[7] = local_4e0;
  if (in_RDI[8] < in_RDI[10]) {
    local_4e4 = in_RDI[10];
  }
  else {
    local_4e4 = in_RDI[8];
  }
  if (in_RDI[8] < in_RDI[10]) {
    local_4e8 = in_RDI[8];
  }
  else {
    local_4e8 = in_RDI[10];
  }
  if (in_RDI[8] < in_RDI[10]) {
    local_4ec = in_RSI[10];
  }
  else {
    local_4ec = in_RSI[8];
  }
  if (in_RDI[8] < in_RDI[10]) {
    local_4f0 = in_RSI[8];
  }
  else {
    local_4f0 = in_RSI[10];
  }
  in_RDI[8] = local_4e4;
  in_RDI[10] = local_4e8;
  in_RSI[8] = local_4ec;
  in_RSI[10] = local_4f0;
  if (in_RDI[9] < in_RDI[0xb]) {
    local_4f4 = in_RDI[0xb];
  }
  else {
    local_4f4 = in_RDI[9];
  }
  if (in_RDI[9] < in_RDI[0xb]) {
    local_4f8 = in_RDI[9];
  }
  else {
    local_4f8 = in_RDI[0xb];
  }
  if (in_RDI[9] < in_RDI[0xb]) {
    local_4fc = in_RSI[0xb];
  }
  else {
    local_4fc = in_RSI[9];
  }
  if (in_RDI[9] < in_RDI[0xb]) {
    local_500 = in_RSI[9];
  }
  else {
    local_500 = in_RSI[0xb];
  }
  in_RDI[9] = local_4f4;
  in_RDI[0xb] = local_4f8;
  in_RSI[9] = local_4fc;
  in_RSI[0xb] = local_500;
  if (in_RDI[0xc] < in_RDI[0xe]) {
    local_504 = in_RDI[0xe];
  }
  else {
    local_504 = in_RDI[0xc];
  }
  if (in_RDI[0xc] < in_RDI[0xe]) {
    local_508 = in_RDI[0xc];
  }
  else {
    local_508 = in_RDI[0xe];
  }
  if (in_RDI[0xc] < in_RDI[0xe]) {
    local_50c = in_RSI[0xe];
  }
  else {
    local_50c = in_RSI[0xc];
  }
  if (in_RDI[0xc] < in_RDI[0xe]) {
    local_510 = in_RSI[0xc];
  }
  else {
    local_510 = in_RSI[0xe];
  }
  in_RDI[0xc] = local_504;
  in_RDI[0xe] = local_508;
  in_RSI[0xc] = local_50c;
  in_RSI[0xe] = local_510;
  if (in_RDI[0xd] < in_RDI[0xf]) {
    local_514 = in_RDI[0xf];
  }
  else {
    local_514 = in_RDI[0xd];
  }
  if (in_RDI[0xd] < in_RDI[0xf]) {
    local_518 = in_RDI[0xd];
  }
  else {
    local_518 = in_RDI[0xf];
  }
  if (in_RDI[0xd] < in_RDI[0xf]) {
    local_51c = in_RSI[0xf];
  }
  else {
    local_51c = in_RSI[0xd];
  }
  if (in_RDI[0xd] < in_RDI[0xf]) {
    local_520 = in_RSI[0xd];
  }
  else {
    local_520 = in_RSI[0xf];
  }
  in_RDI[0xd] = local_514;
  in_RDI[0xf] = local_518;
  in_RSI[0xd] = local_51c;
  in_RSI[0xf] = local_520;
  if (in_RDI[1] < in_RDI[2]) {
    local_524 = in_RDI[2];
  }
  else {
    local_524 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[2]) {
    local_528 = in_RDI[1];
  }
  else {
    local_528 = in_RDI[2];
  }
  if (in_RDI[1] < in_RDI[2]) {
    local_52c = in_RSI[2];
  }
  else {
    local_52c = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[2]) {
    local_530 = in_RSI[1];
  }
  else {
    local_530 = in_RSI[2];
  }
  in_RDI[1] = local_524;
  in_RDI[2] = local_528;
  in_RSI[1] = local_52c;
  in_RSI[2] = local_530;
  if (in_RDI[5] < in_RDI[6]) {
    local_534 = in_RDI[6];
  }
  else {
    local_534 = in_RDI[5];
  }
  if (in_RDI[5] < in_RDI[6]) {
    local_538 = in_RDI[5];
  }
  else {
    local_538 = in_RDI[6];
  }
  if (in_RDI[5] < in_RDI[6]) {
    local_53c = in_RSI[6];
  }
  else {
    local_53c = in_RSI[5];
  }
  if (in_RDI[5] < in_RDI[6]) {
    local_540 = in_RSI[5];
  }
  else {
    local_540 = in_RSI[6];
  }
  in_RDI[5] = local_534;
  in_RDI[6] = local_538;
  in_RSI[5] = local_53c;
  in_RSI[6] = local_540;
  if (*in_RDI < in_RDI[4]) {
    local_544 = in_RDI[4];
  }
  else {
    local_544 = *in_RDI;
  }
  if (*in_RDI < in_RDI[4]) {
    local_548 = *in_RDI;
  }
  else {
    local_548 = in_RDI[4];
  }
  if (*in_RDI < in_RDI[4]) {
    local_54c = in_RSI[4];
  }
  else {
    local_54c = *in_RSI;
  }
  if (*in_RDI < in_RDI[4]) {
    local_550 = *in_RSI;
  }
  else {
    local_550 = in_RSI[4];
  }
  *in_RDI = local_544;
  in_RDI[4] = local_548;
  *in_RSI = local_54c;
  in_RSI[4] = local_550;
  if (in_RDI[3] < in_RDI[7]) {
    local_554 = in_RDI[7];
  }
  else {
    local_554 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[7]) {
    local_558 = in_RDI[3];
  }
  else {
    local_558 = in_RDI[7];
  }
  if (in_RDI[3] < in_RDI[7]) {
    local_55c = in_RSI[7];
  }
  else {
    local_55c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[7]) {
    local_560 = in_RSI[3];
  }
  else {
    local_560 = in_RSI[7];
  }
  in_RDI[3] = local_554;
  in_RDI[7] = local_558;
  in_RSI[3] = local_55c;
  in_RSI[7] = local_560;
  if (in_RDI[9] < in_RDI[10]) {
    local_564 = in_RDI[10];
  }
  else {
    local_564 = in_RDI[9];
  }
  if (in_RDI[9] < in_RDI[10]) {
    local_568 = in_RDI[9];
  }
  else {
    local_568 = in_RDI[10];
  }
  if (in_RDI[9] < in_RDI[10]) {
    local_56c = in_RSI[10];
  }
  else {
    local_56c = in_RSI[9];
  }
  if (in_RDI[9] < in_RDI[10]) {
    local_570 = in_RSI[9];
  }
  else {
    local_570 = in_RSI[10];
  }
  in_RDI[9] = local_564;
  in_RDI[10] = local_568;
  in_RSI[9] = local_56c;
  in_RSI[10] = local_570;
  if (in_RDI[0xd] < in_RDI[0xe]) {
    local_574 = in_RDI[0xe];
  }
  else {
    local_574 = in_RDI[0xd];
  }
  if (in_RDI[0xd] < in_RDI[0xe]) {
    local_578 = in_RDI[0xd];
  }
  else {
    local_578 = in_RDI[0xe];
  }
  if (in_RDI[0xd] < in_RDI[0xe]) {
    local_57c = in_RSI[0xe];
  }
  else {
    local_57c = in_RSI[0xd];
  }
  if (in_RDI[0xd] < in_RDI[0xe]) {
    local_580 = in_RSI[0xd];
  }
  else {
    local_580 = in_RSI[0xe];
  }
  in_RDI[0xd] = local_574;
  in_RDI[0xe] = local_578;
  in_RSI[0xd] = local_57c;
  in_RSI[0xe] = local_580;
  if (in_RDI[8] < in_RDI[0xc]) {
    local_584 = in_RDI[0xc];
  }
  else {
    local_584 = in_RDI[8];
  }
  if (in_RDI[8] < in_RDI[0xc]) {
    local_588 = in_RDI[8];
  }
  else {
    local_588 = in_RDI[0xc];
  }
  if (in_RDI[8] < in_RDI[0xc]) {
    local_58c = in_RSI[0xc];
  }
  else {
    local_58c = in_RSI[8];
  }
  if (in_RDI[8] < in_RDI[0xc]) {
    local_590 = in_RSI[8];
  }
  else {
    local_590 = in_RSI[0xc];
  }
  in_RDI[8] = local_584;
  in_RDI[0xc] = local_588;
  in_RSI[8] = local_58c;
  in_RSI[0xc] = local_590;
  if (in_RDI[0xb] < in_RDI[0xf]) {
    local_594 = in_RDI[0xf];
  }
  else {
    local_594 = in_RDI[0xb];
  }
  if (in_RDI[0xb] < in_RDI[0xf]) {
    local_598 = in_RDI[0xb];
  }
  else {
    local_598 = in_RDI[0xf];
  }
  if (in_RDI[0xb] < in_RDI[0xf]) {
    local_59c = in_RSI[0xf];
  }
  else {
    local_59c = in_RSI[0xb];
  }
  if (in_RDI[0xb] < in_RDI[0xf]) {
    local_5a0 = in_RSI[0xb];
  }
  else {
    local_5a0 = in_RSI[0xf];
  }
  in_RDI[0xb] = local_594;
  in_RDI[0xf] = local_598;
  in_RSI[0xb] = local_59c;
  in_RSI[0xf] = local_5a0;
  if (in_RDI[1] < in_RDI[5]) {
    local_5a4 = in_RDI[5];
  }
  else {
    local_5a4 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[5]) {
    local_5a8 = in_RDI[1];
  }
  else {
    local_5a8 = in_RDI[5];
  }
  if (in_RDI[1] < in_RDI[5]) {
    local_5ac = in_RSI[5];
  }
  else {
    local_5ac = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[5]) {
    local_5b0 = in_RSI[1];
  }
  else {
    local_5b0 = in_RSI[5];
  }
  in_RDI[1] = local_5a4;
  in_RDI[5] = local_5a8;
  in_RSI[1] = local_5ac;
  in_RSI[5] = local_5b0;
  if (in_RDI[2] < in_RDI[6]) {
    local_5b4 = in_RDI[6];
  }
  else {
    local_5b4 = in_RDI[2];
  }
  if (in_RDI[2] < in_RDI[6]) {
    local_5b8 = in_RDI[2];
  }
  else {
    local_5b8 = in_RDI[6];
  }
  if (in_RDI[2] < in_RDI[6]) {
    local_5bc = in_RSI[6];
  }
  else {
    local_5bc = in_RSI[2];
  }
  if (in_RDI[2] < in_RDI[6]) {
    local_5c0 = in_RSI[2];
  }
  else {
    local_5c0 = in_RSI[6];
  }
  in_RDI[2] = local_5b4;
  in_RDI[6] = local_5b8;
  in_RSI[2] = local_5bc;
  in_RSI[6] = local_5c0;
  if (in_RDI[9] < in_RDI[0xd]) {
    local_5c4 = in_RDI[0xd];
  }
  else {
    local_5c4 = in_RDI[9];
  }
  if (in_RDI[9] < in_RDI[0xd]) {
    local_5c8 = in_RDI[9];
  }
  else {
    local_5c8 = in_RDI[0xd];
  }
  if (in_RDI[9] < in_RDI[0xd]) {
    local_5cc = in_RSI[0xd];
  }
  else {
    local_5cc = in_RSI[9];
  }
  if (in_RDI[9] < in_RDI[0xd]) {
    local_5d0 = in_RSI[9];
  }
  else {
    local_5d0 = in_RSI[0xd];
  }
  in_RDI[9] = local_5c4;
  in_RDI[0xd] = local_5c8;
  in_RSI[9] = local_5cc;
  in_RSI[0xd] = local_5d0;
  if (in_RDI[10] < in_RDI[0xe]) {
    local_5d4 = in_RDI[0xe];
  }
  else {
    local_5d4 = in_RDI[10];
  }
  if (in_RDI[10] < in_RDI[0xe]) {
    local_5d8 = in_RDI[10];
  }
  else {
    local_5d8 = in_RDI[0xe];
  }
  if (in_RDI[10] < in_RDI[0xe]) {
    local_5dc = in_RSI[0xe];
  }
  else {
    local_5dc = in_RSI[10];
  }
  if (in_RDI[10] < in_RDI[0xe]) {
    local_5e0 = in_RSI[10];
  }
  else {
    local_5e0 = in_RSI[0xe];
  }
  in_RDI[10] = local_5d4;
  in_RDI[0xe] = local_5d8;
  in_RSI[10] = local_5dc;
  in_RSI[0xe] = local_5e0;
  if (*in_RDI < in_RDI[8]) {
    local_5e4 = in_RDI[8];
  }
  else {
    local_5e4 = *in_RDI;
  }
  if (*in_RDI < in_RDI[8]) {
    local_5e8 = *in_RDI;
  }
  else {
    local_5e8 = in_RDI[8];
  }
  if (*in_RDI < in_RDI[8]) {
    local_5ec = in_RSI[8];
  }
  else {
    local_5ec = *in_RSI;
  }
  if (*in_RDI < in_RDI[8]) {
    local_5f0 = *in_RSI;
  }
  else {
    local_5f0 = in_RSI[8];
  }
  *in_RDI = local_5e4;
  in_RDI[8] = local_5e8;
  *in_RSI = local_5ec;
  in_RSI[8] = local_5f0;
  if (in_RDI[7] < in_RDI[0xf]) {
    local_5f4 = in_RDI[0xf];
  }
  else {
    local_5f4 = in_RDI[7];
  }
  if (in_RDI[7] < in_RDI[0xf]) {
    local_5f8 = in_RDI[7];
  }
  else {
    local_5f8 = in_RDI[0xf];
  }
  if (in_RDI[7] < in_RDI[0xf]) {
    local_5fc = in_RSI[0xf];
  }
  else {
    local_5fc = in_RSI[7];
  }
  if (in_RDI[7] < in_RDI[0xf]) {
    local_600 = in_RSI[7];
  }
  else {
    local_600 = in_RSI[0xf];
  }
  in_RDI[7] = local_5f4;
  in_RDI[0xf] = local_5f8;
  in_RSI[7] = local_5fc;
  in_RSI[0xf] = local_600;
  if (in_RDI[1] < in_RDI[4]) {
    local_604 = in_RDI[4];
  }
  else {
    local_604 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[4]) {
    local_608 = in_RDI[1];
  }
  else {
    local_608 = in_RDI[4];
  }
  if (in_RDI[1] < in_RDI[4]) {
    local_60c = in_RSI[4];
  }
  else {
    local_60c = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[4]) {
    local_610 = in_RSI[1];
  }
  else {
    local_610 = in_RSI[4];
  }
  in_RDI[1] = local_604;
  in_RDI[4] = local_608;
  in_RSI[1] = local_60c;
  in_RSI[4] = local_610;
  if (in_RDI[3] < in_RDI[6]) {
    local_614 = in_RDI[6];
  }
  else {
    local_614 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[6]) {
    local_618 = in_RDI[3];
  }
  else {
    local_618 = in_RDI[6];
  }
  if (in_RDI[3] < in_RDI[6]) {
    local_61c = in_RSI[6];
  }
  else {
    local_61c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[6]) {
    local_620 = in_RSI[3];
  }
  else {
    local_620 = in_RSI[6];
  }
  in_RDI[3] = local_614;
  in_RDI[6] = local_618;
  in_RSI[3] = local_61c;
  in_RSI[6] = local_620;
  if (in_RDI[9] < in_RDI[0xc]) {
    local_624 = in_RDI[0xc];
  }
  else {
    local_624 = in_RDI[9];
  }
  if (in_RDI[9] < in_RDI[0xc]) {
    local_628 = in_RDI[9];
  }
  else {
    local_628 = in_RDI[0xc];
  }
  if (in_RDI[9] < in_RDI[0xc]) {
    local_62c = in_RSI[0xc];
  }
  else {
    local_62c = in_RSI[9];
  }
  if (in_RDI[9] < in_RDI[0xc]) {
    local_630 = in_RSI[9];
  }
  else {
    local_630 = in_RSI[0xc];
  }
  in_RDI[9] = local_624;
  in_RDI[0xc] = local_628;
  in_RSI[9] = local_62c;
  in_RSI[0xc] = local_630;
  if (in_RDI[0xb] < in_RDI[0xe]) {
    local_634 = in_RDI[0xe];
  }
  else {
    local_634 = in_RDI[0xb];
  }
  if (in_RDI[0xb] < in_RDI[0xe]) {
    local_638 = in_RDI[0xb];
  }
  else {
    local_638 = in_RDI[0xe];
  }
  if (in_RDI[0xb] < in_RDI[0xe]) {
    local_63c = in_RSI[0xe];
  }
  else {
    local_63c = in_RSI[0xb];
  }
  if (in_RDI[0xb] < in_RDI[0xe]) {
    local_640 = in_RSI[0xb];
  }
  else {
    local_640 = in_RSI[0xe];
  }
  in_RDI[0xb] = local_634;
  in_RDI[0xe] = local_638;
  in_RSI[0xb] = local_63c;
  in_RSI[0xe] = local_640;
  if (in_RDI[2] < in_RDI[4]) {
    local_644 = in_RDI[4];
  }
  else {
    local_644 = in_RDI[2];
  }
  if (in_RDI[2] < in_RDI[4]) {
    local_648 = in_RDI[2];
  }
  else {
    local_648 = in_RDI[4];
  }
  if (in_RDI[2] < in_RDI[4]) {
    local_64c = in_RSI[4];
  }
  else {
    local_64c = in_RSI[2];
  }
  if (in_RDI[2] < in_RDI[4]) {
    local_650 = in_RSI[2];
  }
  else {
    local_650 = in_RSI[4];
  }
  in_RDI[2] = local_644;
  in_RDI[4] = local_648;
  in_RSI[2] = local_64c;
  in_RSI[4] = local_650;
  if (in_RDI[3] < in_RDI[5]) {
    local_654 = in_RDI[5];
  }
  else {
    local_654 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[5]) {
    local_658 = in_RDI[3];
  }
  else {
    local_658 = in_RDI[5];
  }
  if (in_RDI[3] < in_RDI[5]) {
    local_65c = in_RSI[5];
  }
  else {
    local_65c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[5]) {
    local_660 = in_RSI[3];
  }
  else {
    local_660 = in_RSI[5];
  }
  in_RDI[3] = local_654;
  in_RDI[5] = local_658;
  in_RSI[3] = local_65c;
  in_RSI[5] = local_660;
  if (in_RDI[10] < in_RDI[0xc]) {
    local_664 = in_RDI[0xc];
  }
  else {
    local_664 = in_RDI[10];
  }
  if (in_RDI[10] < in_RDI[0xc]) {
    local_668 = in_RDI[10];
  }
  else {
    local_668 = in_RDI[0xc];
  }
  if (in_RDI[10] < in_RDI[0xc]) {
    local_66c = in_RSI[0xc];
  }
  else {
    local_66c = in_RSI[10];
  }
  if (in_RDI[10] < in_RDI[0xc]) {
    local_670 = in_RSI[10];
  }
  else {
    local_670 = in_RSI[0xc];
  }
  in_RDI[10] = local_664;
  in_RDI[0xc] = local_668;
  in_RSI[10] = local_66c;
  in_RSI[0xc] = local_670;
  if (in_RDI[0xb] < in_RDI[0xd]) {
    local_674 = in_RDI[0xd];
  }
  else {
    local_674 = in_RDI[0xb];
  }
  if (in_RDI[0xb] < in_RDI[0xd]) {
    local_678 = in_RDI[0xb];
  }
  else {
    local_678 = in_RDI[0xd];
  }
  if (in_RDI[0xb] < in_RDI[0xd]) {
    local_67c = in_RSI[0xd];
  }
  else {
    local_67c = in_RSI[0xb];
  }
  if (in_RDI[0xb] < in_RDI[0xd]) {
    local_680 = in_RSI[0xb];
  }
  else {
    local_680 = in_RSI[0xd];
  }
  in_RDI[0xb] = local_674;
  in_RDI[0xd] = local_678;
  in_RSI[0xb] = local_67c;
  in_RSI[0xd] = local_680;
  if (in_RDI[1] < in_RDI[9]) {
    local_684 = in_RDI[9];
  }
  else {
    local_684 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[9]) {
    local_688 = in_RDI[1];
  }
  else {
    local_688 = in_RDI[9];
  }
  if (in_RDI[1] < in_RDI[9]) {
    local_68c = in_RSI[9];
  }
  else {
    local_68c = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[9]) {
    local_690 = in_RSI[1];
  }
  else {
    local_690 = in_RSI[9];
  }
  in_RDI[1] = local_684;
  in_RDI[9] = local_688;
  in_RSI[1] = local_68c;
  in_RSI[9] = local_690;
  if (in_RDI[6] < in_RDI[0xe]) {
    local_694 = in_RDI[0xe];
  }
  else {
    local_694 = in_RDI[6];
  }
  if (in_RDI[6] < in_RDI[0xe]) {
    local_698 = in_RDI[6];
  }
  else {
    local_698 = in_RDI[0xe];
  }
  if (in_RDI[6] < in_RDI[0xe]) {
    local_69c = in_RSI[0xe];
  }
  else {
    local_69c = in_RSI[6];
  }
  if (in_RDI[6] < in_RDI[0xe]) {
    local_6a0 = in_RSI[6];
  }
  else {
    local_6a0 = in_RSI[0xe];
  }
  in_RDI[6] = local_694;
  in_RDI[0xe] = local_698;
  in_RSI[6] = local_69c;
  in_RSI[0xe] = local_6a0;
  if (in_RDI[3] < in_RDI[4]) {
    local_6a4 = in_RDI[4];
  }
  else {
    local_6a4 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[4]) {
    local_6a8 = in_RDI[3];
  }
  else {
    local_6a8 = in_RDI[4];
  }
  if (in_RDI[3] < in_RDI[4]) {
    local_6ac = in_RSI[4];
  }
  else {
    local_6ac = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[4]) {
    local_6b0 = in_RSI[3];
  }
  else {
    local_6b0 = in_RSI[4];
  }
  in_RDI[3] = local_6a4;
  in_RDI[4] = local_6a8;
  in_RSI[3] = local_6ac;
  in_RSI[4] = local_6b0;
  if (in_RDI[0xb] < in_RDI[0xc]) {
    local_6b4 = in_RDI[0xc];
  }
  else {
    local_6b4 = in_RDI[0xb];
  }
  if (in_RDI[0xb] < in_RDI[0xc]) {
    local_6b8 = in_RDI[0xb];
  }
  else {
    local_6b8 = in_RDI[0xc];
  }
  if (in_RDI[0xb] < in_RDI[0xc]) {
    local_6bc = in_RSI[0xc];
  }
  else {
    local_6bc = in_RSI[0xb];
  }
  if (in_RDI[0xb] < in_RDI[0xc]) {
    local_6c0 = in_RSI[0xb];
  }
  else {
    local_6c0 = in_RSI[0xc];
  }
  in_RDI[0xb] = local_6b4;
  in_RDI[0xc] = local_6b8;
  in_RSI[0xb] = local_6bc;
  in_RSI[0xc] = local_6c0;
  if (in_RDI[1] < in_RDI[8]) {
    local_6c4 = in_RDI[8];
  }
  else {
    local_6c4 = in_RDI[1];
  }
  if (in_RDI[1] < in_RDI[8]) {
    local_6c8 = in_RDI[1];
  }
  else {
    local_6c8 = in_RDI[8];
  }
  if (in_RDI[1] < in_RDI[8]) {
    local_6cc = in_RSI[8];
  }
  else {
    local_6cc = in_RSI[1];
  }
  if (in_RDI[1] < in_RDI[8]) {
    local_6d0 = in_RSI[1];
  }
  else {
    local_6d0 = in_RSI[8];
  }
  in_RDI[1] = local_6c4;
  in_RDI[8] = local_6c8;
  in_RSI[1] = local_6cc;
  in_RSI[8] = local_6d0;
  if (in_RDI[2] < in_RDI[10]) {
    local_6d4 = in_RDI[10];
  }
  else {
    local_6d4 = in_RDI[2];
  }
  if (in_RDI[2] < in_RDI[10]) {
    local_6d8 = in_RDI[2];
  }
  else {
    local_6d8 = in_RDI[10];
  }
  if (in_RDI[2] < in_RDI[10]) {
    local_6dc = in_RSI[10];
  }
  else {
    local_6dc = in_RSI[2];
  }
  if (in_RDI[2] < in_RDI[10]) {
    local_6e0 = in_RSI[2];
  }
  else {
    local_6e0 = in_RSI[10];
  }
  in_RDI[2] = local_6d4;
  in_RDI[10] = local_6d8;
  in_RSI[2] = local_6dc;
  in_RSI[10] = local_6e0;
  if (in_RDI[5] < in_RDI[0xd]) {
    local_6e4 = in_RDI[0xd];
  }
  else {
    local_6e4 = in_RDI[5];
  }
  if (in_RDI[5] < in_RDI[0xd]) {
    local_6e8 = in_RDI[5];
  }
  else {
    local_6e8 = in_RDI[0xd];
  }
  if (in_RDI[5] < in_RDI[0xd]) {
    local_6ec = in_RSI[0xd];
  }
  else {
    local_6ec = in_RSI[5];
  }
  if (in_RDI[5] < in_RDI[0xd]) {
    local_6f0 = in_RSI[5];
  }
  else {
    local_6f0 = in_RSI[0xd];
  }
  in_RDI[5] = local_6e4;
  in_RDI[0xd] = local_6e8;
  in_RSI[5] = local_6ec;
  in_RSI[0xd] = local_6f0;
  if (in_RDI[7] < in_RDI[0xe]) {
    local_6f4 = in_RDI[0xe];
  }
  else {
    local_6f4 = in_RDI[7];
  }
  if (in_RDI[7] < in_RDI[0xe]) {
    local_6f8 = in_RDI[7];
  }
  else {
    local_6f8 = in_RDI[0xe];
  }
  if (in_RDI[7] < in_RDI[0xe]) {
    local_6fc = in_RSI[0xe];
  }
  else {
    local_6fc = in_RSI[7];
  }
  if (in_RDI[7] < in_RDI[0xe]) {
    local_700 = in_RSI[7];
  }
  else {
    local_700 = in_RSI[0xe];
  }
  in_RDI[7] = local_6f4;
  in_RDI[0xe] = local_6f8;
  in_RSI[7] = local_6fc;
  in_RSI[0xe] = local_700;
  if (in_RDI[3] < in_RDI[0xb]) {
    local_704 = in_RDI[0xb];
  }
  else {
    local_704 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[0xb]) {
    local_708 = in_RDI[3];
  }
  else {
    local_708 = in_RDI[0xb];
  }
  if (in_RDI[3] < in_RDI[0xb]) {
    local_70c = in_RSI[0xb];
  }
  else {
    local_70c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[0xb]) {
    local_710 = in_RSI[3];
  }
  else {
    local_710 = in_RSI[0xb];
  }
  in_RDI[3] = local_704;
  in_RDI[0xb] = local_708;
  in_RSI[3] = local_70c;
  in_RSI[0xb] = local_710;
  if (in_RDI[2] < in_RDI[8]) {
    local_714 = in_RDI[8];
  }
  else {
    local_714 = in_RDI[2];
  }
  if (in_RDI[2] < in_RDI[8]) {
    local_718 = in_RDI[2];
  }
  else {
    local_718 = in_RDI[8];
  }
  if (in_RDI[2] < in_RDI[8]) {
    local_71c = in_RSI[8];
  }
  else {
    local_71c = in_RSI[2];
  }
  if (in_RDI[2] < in_RDI[8]) {
    local_720 = in_RSI[2];
  }
  else {
    local_720 = in_RSI[8];
  }
  in_RDI[2] = local_714;
  in_RDI[8] = local_718;
  in_RSI[2] = local_71c;
  in_RSI[8] = local_720;
  if (in_RDI[4] < in_RDI[0xc]) {
    local_724 = in_RDI[0xc];
  }
  else {
    local_724 = in_RDI[4];
  }
  if (in_RDI[4] < in_RDI[0xc]) {
    local_728 = in_RDI[4];
  }
  else {
    local_728 = in_RDI[0xc];
  }
  if (in_RDI[4] < in_RDI[0xc]) {
    local_72c = in_RSI[0xc];
  }
  else {
    local_72c = in_RSI[4];
  }
  if (in_RDI[4] < in_RDI[0xc]) {
    local_730 = in_RSI[4];
  }
  else {
    local_730 = in_RSI[0xc];
  }
  in_RDI[4] = local_724;
  in_RDI[0xc] = local_728;
  in_RSI[4] = local_72c;
  in_RSI[0xc] = local_730;
  if (in_RDI[7] < in_RDI[0xd]) {
    local_734 = in_RDI[0xd];
  }
  else {
    local_734 = in_RDI[7];
  }
  if (in_RDI[7] < in_RDI[0xd]) {
    local_738 = in_RDI[7];
  }
  else {
    local_738 = in_RDI[0xd];
  }
  if (in_RDI[7] < in_RDI[0xd]) {
    local_73c = in_RSI[0xd];
  }
  else {
    local_73c = in_RSI[7];
  }
  if (in_RDI[7] < in_RDI[0xd]) {
    local_740 = in_RSI[7];
  }
  else {
    local_740 = in_RSI[0xd];
  }
  in_RDI[7] = local_734;
  in_RDI[0xd] = local_738;
  in_RSI[7] = local_73c;
  in_RSI[0xd] = local_740;
  if (in_RDI[3] < in_RDI[10]) {
    local_744 = in_RDI[10];
  }
  else {
    local_744 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[10]) {
    local_748 = in_RDI[3];
  }
  else {
    local_748 = in_RDI[10];
  }
  if (in_RDI[3] < in_RDI[10]) {
    local_74c = in_RSI[10];
  }
  else {
    local_74c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[10]) {
    local_750 = in_RSI[3];
  }
  else {
    local_750 = in_RSI[10];
  }
  in_RDI[3] = local_744;
  in_RDI[10] = local_748;
  in_RSI[3] = local_74c;
  in_RSI[10] = local_750;
  if (in_RDI[5] < in_RDI[0xc]) {
    local_754 = in_RDI[0xc];
  }
  else {
    local_754 = in_RDI[5];
  }
  if (in_RDI[5] < in_RDI[0xc]) {
    local_758 = in_RDI[5];
  }
  else {
    local_758 = in_RDI[0xc];
  }
  if (in_RDI[5] < in_RDI[0xc]) {
    local_75c = in_RSI[0xc];
  }
  else {
    local_75c = in_RSI[5];
  }
  if (in_RDI[5] < in_RDI[0xc]) {
    local_760 = in_RSI[5];
  }
  else {
    local_760 = in_RSI[0xc];
  }
  in_RDI[5] = local_754;
  in_RDI[0xc] = local_758;
  in_RSI[5] = local_75c;
  in_RSI[0xc] = local_760;
  if (in_RDI[3] < in_RDI[9]) {
    local_764 = in_RDI[9];
  }
  else {
    local_764 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[9]) {
    local_768 = in_RDI[3];
  }
  else {
    local_768 = in_RDI[9];
  }
  if (in_RDI[3] < in_RDI[9]) {
    local_76c = in_RSI[9];
  }
  else {
    local_76c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[9]) {
    local_770 = in_RSI[3];
  }
  else {
    local_770 = in_RSI[9];
  }
  in_RDI[3] = local_764;
  in_RDI[9] = local_768;
  in_RSI[3] = local_76c;
  in_RSI[9] = local_770;
  if (in_RDI[6] < in_RDI[0xc]) {
    local_774 = in_RDI[0xc];
  }
  else {
    local_774 = in_RDI[6];
  }
  if (in_RDI[6] < in_RDI[0xc]) {
    local_778 = in_RDI[6];
  }
  else {
    local_778 = in_RDI[0xc];
  }
  if (in_RDI[6] < in_RDI[0xc]) {
    local_77c = in_RSI[0xc];
  }
  else {
    local_77c = in_RSI[6];
  }
  if (in_RDI[6] < in_RDI[0xc]) {
    local_780 = in_RSI[6];
  }
  else {
    local_780 = in_RSI[0xc];
  }
  in_RDI[6] = local_774;
  in_RDI[0xc] = local_778;
  in_RSI[6] = local_77c;
  in_RSI[0xc] = local_780;
  if (in_RDI[3] < in_RDI[8]) {
    local_784 = in_RDI[8];
  }
  else {
    local_784 = in_RDI[3];
  }
  if (in_RDI[3] < in_RDI[8]) {
    local_788 = in_RDI[3];
  }
  else {
    local_788 = in_RDI[8];
  }
  if (in_RDI[3] < in_RDI[8]) {
    local_78c = in_RSI[8];
  }
  else {
    local_78c = in_RSI[3];
  }
  if (in_RDI[3] < in_RDI[8]) {
    local_790 = in_RSI[3];
  }
  else {
    local_790 = in_RSI[8];
  }
  in_RDI[3] = local_784;
  in_RDI[8] = local_788;
  in_RSI[3] = local_78c;
  in_RSI[8] = local_790;
  if (in_RDI[7] < in_RDI[0xc]) {
    local_794 = in_RDI[0xc];
  }
  else {
    local_794 = in_RDI[7];
  }
  if (in_RDI[7] < in_RDI[0xc]) {
    local_798 = in_RDI[7];
  }
  else {
    local_798 = in_RDI[0xc];
  }
  if (in_RDI[7] < in_RDI[0xc]) {
    local_79c = in_RSI[0xc];
  }
  else {
    local_79c = in_RSI[7];
  }
  if (in_RDI[7] < in_RDI[0xc]) {
    local_7a0 = in_RSI[7];
  }
  else {
    local_7a0 = in_RSI[0xc];
  }
  in_RDI[7] = local_794;
  in_RDI[0xc] = local_798;
  in_RSI[7] = local_79c;
  in_RSI[0xc] = local_7a0;
  if (in_RDI[5] < in_RDI[9]) {
    local_7a4 = in_RDI[9];
  }
  else {
    local_7a4 = in_RDI[5];
  }
  if (in_RDI[5] < in_RDI[9]) {
    local_7a8 = in_RDI[5];
  }
  else {
    local_7a8 = in_RDI[9];
  }
  if (in_RDI[5] < in_RDI[9]) {
    local_7ac = in_RSI[9];
  }
  else {
    local_7ac = in_RSI[5];
  }
  if (in_RDI[5] < in_RDI[9]) {
    local_7b0 = in_RSI[5];
  }
  else {
    local_7b0 = in_RSI[9];
  }
  in_RDI[5] = local_7a4;
  in_RDI[9] = local_7a8;
  in_RSI[5] = local_7ac;
  in_RSI[9] = local_7b0;
  if (in_RDI[6] < in_RDI[10]) {
    local_7b4 = in_RDI[10];
  }
  else {
    local_7b4 = in_RDI[6];
  }
  if (in_RDI[6] < in_RDI[10]) {
    local_7b8 = in_RDI[6];
  }
  else {
    local_7b8 = in_RDI[10];
  }
  if (in_RDI[6] < in_RDI[10]) {
    local_7bc = in_RSI[10];
  }
  else {
    local_7bc = in_RSI[6];
  }
  if (in_RDI[6] < in_RDI[10]) {
    local_7c0 = in_RSI[6];
  }
  else {
    local_7c0 = in_RSI[10];
  }
  in_RDI[6] = local_7b4;
  in_RDI[10] = local_7b8;
  in_RSI[6] = local_7bc;
  in_RSI[10] = local_7c0;
  if (in_RDI[4] < in_RDI[8]) {
    local_7c4 = in_RDI[8];
  }
  else {
    local_7c4 = in_RDI[4];
  }
  if (in_RDI[4] < in_RDI[8]) {
    local_7c8 = in_RDI[4];
  }
  else {
    local_7c8 = in_RDI[8];
  }
  if (in_RDI[4] < in_RDI[8]) {
    local_7cc = in_RSI[8];
  }
  else {
    local_7cc = in_RSI[4];
  }
  if (in_RDI[4] < in_RDI[8]) {
    local_7d0 = in_RSI[4];
  }
  else {
    local_7d0 = in_RSI[8];
  }
  in_RDI[4] = local_7c4;
  in_RDI[8] = local_7c8;
  in_RSI[4] = local_7cc;
  in_RSI[8] = local_7d0;
  if (in_RDI[7] < in_RDI[0xb]) {
    local_7d4 = in_RDI[0xb];
  }
  else {
    local_7d4 = in_RDI[7];
  }
  if (in_RDI[7] < in_RDI[0xb]) {
    local_7d8 = in_RDI[7];
  }
  else {
    local_7d8 = in_RDI[0xb];
  }
  if (in_RDI[7] < in_RDI[0xb]) {
    local_7dc = in_RSI[0xb];
  }
  else {
    local_7dc = in_RSI[7];
  }
  if (in_RDI[7] < in_RDI[0xb]) {
    local_7e0 = in_RSI[7];
  }
  else {
    local_7e0 = in_RSI[0xb];
  }
  in_RDI[7] = local_7d4;
  in_RDI[0xb] = local_7d8;
  in_RSI[7] = local_7dc;
  in_RSI[0xb] = local_7e0;
  if (in_RDI[5] < in_RDI[8]) {
    local_7e4 = in_RDI[8];
  }
  else {
    local_7e4 = in_RDI[5];
  }
  if (in_RDI[5] < in_RDI[8]) {
    local_7e8 = in_RDI[5];
  }
  else {
    local_7e8 = in_RDI[8];
  }
  if (in_RDI[5] < in_RDI[8]) {
    local_7ec = in_RSI[8];
  }
  else {
    local_7ec = in_RSI[5];
  }
  if (in_RDI[5] < in_RDI[8]) {
    local_7f0 = in_RSI[5];
  }
  else {
    local_7f0 = in_RSI[8];
  }
  in_RDI[5] = local_7e4;
  in_RDI[8] = local_7e8;
  in_RSI[5] = local_7ec;
  in_RSI[8] = local_7f0;
  if (in_RDI[7] < in_RDI[10]) {
    local_7f4 = in_RDI[10];
  }
  else {
    local_7f4 = in_RDI[7];
  }
  if (in_RDI[7] < in_RDI[10]) {
    local_7f8 = in_RDI[7];
  }
  else {
    local_7f8 = in_RDI[10];
  }
  if (in_RDI[7] < in_RDI[10]) {
    local_7fc = in_RSI[10];
  }
  else {
    local_7fc = in_RSI[7];
  }
  if (in_RDI[7] < in_RDI[10]) {
    local_800 = in_RSI[7];
  }
  else {
    local_800 = in_RSI[10];
  }
  in_RDI[7] = local_7f4;
  in_RDI[10] = local_7f8;
  in_RSI[7] = local_7fc;
  in_RSI[10] = local_800;
  if (in_RDI[6] < in_RDI[8]) {
    local_804 = in_RDI[8];
  }
  else {
    local_804 = in_RDI[6];
  }
  if (in_RDI[6] < in_RDI[8]) {
    local_808 = in_RDI[6];
  }
  else {
    local_808 = in_RDI[8];
  }
  if (in_RDI[6] < in_RDI[8]) {
    local_80c = in_RSI[8];
  }
  else {
    local_80c = in_RSI[6];
  }
  if (in_RDI[6] < in_RDI[8]) {
    local_810 = in_RSI[6];
  }
  else {
    local_810 = in_RSI[8];
  }
  in_RDI[6] = local_804;
  in_RDI[8] = local_808;
  in_RSI[6] = local_80c;
  in_RSI[8] = local_810;
  if (in_RDI[7] < in_RDI[9]) {
    local_814 = in_RDI[9];
  }
  else {
    local_814 = in_RDI[7];
  }
  if (in_RDI[7] < in_RDI[9]) {
    local_818 = in_RDI[7];
  }
  else {
    local_818 = in_RDI[9];
  }
  if (in_RDI[7] < in_RDI[9]) {
    local_81c = in_RSI[9];
  }
  else {
    local_81c = in_RSI[7];
  }
  if (in_RDI[7] < in_RDI[9]) {
    local_820 = in_RSI[7];
  }
  else {
    local_820 = in_RSI[9];
  }
  in_RDI[7] = local_814;
  in_RDI[9] = local_818;
  in_RSI[7] = local_81c;
  in_RSI[9] = local_820;
  if (in_RDI[7] < in_RDI[8]) {
    local_824 = in_RDI[8];
  }
  else {
    local_824 = in_RDI[7];
  }
  if (in_RDI[7] < in_RDI[8]) {
    local_828 = in_RDI[7];
  }
  else {
    local_828 = in_RDI[8];
  }
  if (in_RDI[7] < in_RDI[8]) {
    local_82c = in_RSI[8];
  }
  else {
    local_82c = in_RSI[7];
  }
  if (in_RDI[7] < in_RDI[8]) {
    local_830 = in_RSI[7];
  }
  else {
    local_830 = in_RSI[8];
  }
  in_RDI[7] = local_824;
  in_RDI[8] = local_828;
  in_RSI[7] = local_82c;
  in_RSI[8] = local_830;
  return;
}

Assistant:

static inline void av1_sort_fi32_16(float k[], int32_t v[]) {
  SWAP(0, 1);
  SWAP(2, 3);
  SWAP(4, 5);
  SWAP(6, 7);
  SWAP(8, 9);
  SWAP(10, 11);
  SWAP(12, 13);
  SWAP(14, 15);
  SWAP(0, 2);
  SWAP(1, 3);
  SWAP(4, 6);
  SWAP(5, 7);
  SWAP(8, 10);
  SWAP(9, 11);
  SWAP(12, 14);
  SWAP(13, 15);
  SWAP(1, 2);
  SWAP(5, 6);
  SWAP(0, 4);
  SWAP(3, 7);
  SWAP(9, 10);
  SWAP(13, 14);
  SWAP(8, 12);
  SWAP(11, 15);
  SWAP(1, 5);
  SWAP(2, 6);
  SWAP(9, 13);
  SWAP(10, 14);
  SWAP(0, 8);
  SWAP(7, 15);
  SWAP(1, 4);
  SWAP(3, 6);
  SWAP(9, 12);
  SWAP(11, 14);
  SWAP(2, 4);
  SWAP(3, 5);
  SWAP(10, 12);
  SWAP(11, 13);
  SWAP(1, 9);
  SWAP(6, 14);
  SWAP(3, 4);
  SWAP(11, 12);
  SWAP(1, 8);
  SWAP(2, 10);
  SWAP(5, 13);
  SWAP(7, 14);
  SWAP(3, 11);
  SWAP(2, 8);
  SWAP(4, 12);
  SWAP(7, 13);
  SWAP(3, 10);
  SWAP(5, 12);
  SWAP(3, 9);
  SWAP(6, 12);
  SWAP(3, 8);
  SWAP(7, 12);
  SWAP(5, 9);
  SWAP(6, 10);
  SWAP(4, 8);
  SWAP(7, 11);
  SWAP(5, 8);
  SWAP(7, 10);
  SWAP(6, 8);
  SWAP(7, 9);
  SWAP(7, 8);
}